

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O1

void test_convert<int,float>(uint length,int value)

{
  float fVar1;
  bool bVar2;
  int *piVar3;
  undefined8 *puVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  float fVar11;
  shared_ptr<int> pt;
  shared_ptr<float> pu;
  
  uVar7 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar7 = (long)(int)length * 4;
  }
  piVar3 = (int *)operator_new__(uVar7);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,piVar3,nosimd::common::free<int>);
  pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar7);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<float>);
  iVar8 = (int)length >> 2;
  piVar5 = piVar3;
  iVar9 = iVar8;
  if (3 < iVar8) {
    do {
      *piVar5 = value;
      piVar5[1] = value;
      piVar5[2] = value;
      piVar5[3] = value;
      piVar5[4] = value;
      piVar5[5] = value;
      piVar5[6] = value;
      piVar5[7] = value;
      piVar5[8] = value;
      piVar5[9] = value;
      piVar5[10] = value;
      piVar5[0xb] = value;
      piVar5[0xc] = value;
      piVar5[0xd] = value;
      piVar5[0xe] = value;
      piVar5[0xf] = value;
      iVar8 = iVar9 + -4;
      piVar5 = piVar5 + 0x10;
      bVar2 = 7 < iVar9;
      iVar9 = iVar8;
    } while (bVar2);
  }
  if (1 < iVar8) {
    *piVar5 = value;
    piVar5[1] = value;
    piVar5[2] = value;
    piVar5[3] = value;
    piVar5[4] = value;
    piVar5[5] = value;
    piVar5[6] = value;
    piVar5[7] = value;
    iVar8 = iVar8 + -2;
    piVar5 = piVar5 + 8;
  }
  if (iVar8 != 0) {
    *piVar5 = value;
    piVar5[1] = value;
    piVar5[2] = value;
    piVar5[3] = value;
  }
  if ((length & 0xfffffffc) != length) {
    lVar6 = (long)(int)(length & 0xfffffffc);
    do {
      piVar3[lVar6] = value;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)length);
  }
  if (0 < (int)length) {
    uVar7 = 0;
    do {
      *(float *)((long)&(pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                        _vptr__Sp_counted_base + uVar7 * 4) = (float)piVar3[uVar7];
      uVar7 = uVar7 + 1;
    } while (length != uVar7);
  }
  if (length != 0) {
    uVar7 = 0;
    do {
      fVar1 = *(float *)((long)&(pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                _M_pi)->_vptr__Sp_counted_base + uVar7 * 4);
      fVar11 = fVar1 - (float)value;
      uVar10 = -(uint)(fVar11 < 0.0);
      if (1.1920929e-07 <= (float)(~uVar10 & (uint)fVar11 | (uint)((float)value - fVar1) & uVar10))
      {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_convert(unsigned int, _T) [_T = int, _U = float]";
        *(undefined4 *)(puVar4 + 1) = 0x17;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar7 = uVar7 + 1;
    } while (length != uVar7);
  }
  if (pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}